

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

bool __thiscall spvtools::opt::IRContext::RemoveExtension(IRContext *this,Extension extension)

{
  Module *pMVar1;
  FeatureManager *this_00;
  bool bVar2;
  char *__s;
  inst_iterator local_60;
  inst_iterator local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  string_view extensionName;
  
  __s = ExtensionToString(extension);
  extensionName._M_len = strlen(__s);
  local_50._M_unused._M_object = &extensionName;
  pMVar1 = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  local_58.super_iterator.node_ =
       *(iterator *)
        ((long)&(pMVar1->extensions_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  local_60.super_iterator.node_ =
       (iterator)((long)&(pMVar1->extensions_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp:300:7)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp:300:7)>
             ::_M_manager;
  extensionName._M_str = __s;
  bVar2 = KillInstructionIf(this,&local_58,&local_60,
                            (function<bool_(spvtools::opt::Instruction_*)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if ((bVar2) &&
     (this_00 = (this->feature_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl,
     this_00 != (FeatureManager *)0x0)) {
    FeatureManager::RemoveExtension(this_00,extension);
  }
  return bVar2;
}

Assistant:

bool IRContext::RemoveExtension(Extension extension) {
  const std::string_view extensionName = ExtensionToString(extension);
  const bool removed = KillInstructionIf(
      module()->extension_begin(), module()->extension_end(),
      [&extensionName](Instruction* inst) {
        return inst->GetOperand(0).AsString() == extensionName;
      });

  if (removed && feature_mgr_ != nullptr) {
    feature_mgr_->RemoveExtension(extension);
  }

  return removed;
}